

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O1

void h264_print_dec_ref_pic_marking(int idr_pic_flag,h264_dec_ref_pic_marking *ref)

{
  h264_mmco_entry *phVar1;
  long lVar2;
  uint32_t *puVar3;
  char *__format;
  long lVar4;
  int i;
  long lVar5;
  
  if (idr_pic_flag != 0) {
    printf("\tno_output_of_prior_pics_flag = %d\n",(ulong)ref->no_output_of_prior_pics_flag);
    printf("\tlong_term_reference_flag = %d\n",(ulong)ref->long_term_reference_flag);
    return;
  }
  printf("\tadaptive_ref_pic_marking_mode_flag = %d\n",
         (ulong)ref->adaptive_ref_pic_marking_mode_flag);
  if (ref->adaptive_ref_pic_marking_mode_flag != 0) {
    lVar4 = 0xc;
    lVar5 = 0;
    do {
      printf("\tmemory_management_control_operation = %d\n",
             (ulong)*(uint *)((long)ref->mmcos + lVar4 + -0xc));
      phVar1 = ref->mmcos;
      switch(*(undefined4 *)((long)phVar1 + lVar4 + -0xc)) {
      case 1:
        puVar3 = &phVar1[lVar5].difference_of_pic_nums_minus1;
        __format = "\tdifference_of_pic_nums_minus1 = %d\n";
        break;
      case 2:
        puVar3 = &phVar1[lVar5].long_term_pic_num;
        __format = "\tlong_term_pic_num = %d\n";
        break;
      case 3:
        printf("\tdifference_of_pic_nums_minus1 = %d\n",(ulong)*(uint *)((long)phVar1 + lVar4 + -8))
        ;
        puVar3 = &ref->mmcos[lVar5].long_term_frame_idx;
        goto LAB_0010bfbd;
      case 4:
        puVar3 = &phVar1[lVar5].max_long_term_frame_idx_plus1;
        __format = "\tmax_long_term_frame_idx_plus1 = %d\n";
        break;
      default:
        goto switchD_0010bf6d_caseD_5;
      case 6:
        puVar3 = (uint32_t *)((long)&phVar1->memory_management_control_operation + lVar4);
LAB_0010bfbd:
        __format = "\tlong_term_frame_idx = %d\n";
      }
      printf(__format,(ulong)*puVar3);
switchD_0010bf6d_caseD_5:
      lVar5 = lVar5 + 1;
      lVar2 = lVar4 + -0xc;
      lVar4 = lVar4 + 0x14;
    } while (*(int *)((long)ref->mmcos + lVar2) != 0);
  }
  return;
}

Assistant:

void h264_print_dec_ref_pic_marking(int idr_pic_flag, struct h264_dec_ref_pic_marking *ref) {
	if (idr_pic_flag) {
		printf("\tno_output_of_prior_pics_flag = %d\n", ref->no_output_of_prior_pics_flag);
		printf("\tlong_term_reference_flag = %d\n", ref->long_term_reference_flag);
	} else {
		printf("\tadaptive_ref_pic_marking_mode_flag = %d\n", ref->adaptive_ref_pic_marking_mode_flag);
		if (ref->adaptive_ref_pic_marking_mode_flag) {
			int i = 0;
			do {
				printf("\tmemory_management_control_operation = %d\n", ref->mmcos[i].memory_management_control_operation);
				switch (ref->mmcos[i].memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						printf("\tdifference_of_pic_nums_minus1 = %d\n", ref->mmcos[i].difference_of_pic_nums_minus1);
						break;
					case H264_MMCO_FORGET_LONG:
						printf("\tlong_term_pic_num = %d\n", ref->mmcos[i].long_term_pic_num);
						break;
					case H264_MMCO_SHORT_TO_LONG:
						printf("\tdifference_of_pic_nums_minus1 = %d\n", ref->mmcos[i].difference_of_pic_nums_minus1);
						printf("\tlong_term_frame_idx = %d\n", ref->mmcos[i].long_term_frame_idx);
						break;
					case H264_MMCO_FORGET_LONG_MANY:
						printf("\tmax_long_term_frame_idx_plus1 = %d\n", ref->mmcos[i].max_long_term_frame_idx_plus1);
						break;
					case H264_MMCO_FORGET_ALL:
						break;
					case H264_MMCO_THIS_TO_LONG:
						printf("\tlong_term_frame_idx = %d\n", ref->mmcos[i].long_term_frame_idx);
						break;
				}
			} while (ref->mmcos[i++].memory_management_control_operation != H264_MMCO_END);
		}
	}
}